

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

ns_connection * ns_add_sock(ns_mgr *s,sock_t sock,ns_callback_t callback,void *user_data)

{
  ns_connection *pnVar1;
  ns_connection *pnVar2;
  time_t tVar3;
  
  pnVar2 = (ns_connection *)calloc(1,0xa0);
  if (pnVar2 != (ns_connection *)0x0) {
    ns_set_non_blocking_mode(sock);
    ns_set_close_on_exec(sock);
    pnVar2->sock = sock;
    pnVar2->user_data = user_data;
    pnVar2->callback = callback;
    pnVar2->mgr = s;
    tVar3 = time((time_t *)0x0);
    pnVar2->last_io_time = tVar3;
    pnVar1 = s->active_connections;
    pnVar2->next = pnVar1;
    s->active_connections = pnVar2;
    if (pnVar1 != (ns_connection *)0x0) {
      pnVar1->prev = pnVar2;
    }
  }
  return pnVar2;
}

Assistant:

struct ns_connection *ns_add_sock(struct ns_mgr *s, sock_t sock,
                                  ns_callback_t callback, void *user_data) {
  struct ns_connection *conn;
  if ((conn = (struct ns_connection *) NS_MALLOC(sizeof(*conn))) != NULL) {
    memset(conn, 0, sizeof(*conn));
    ns_set_non_blocking_mode(sock);
    ns_set_close_on_exec(sock);
    conn->sock = sock;
    conn->user_data = user_data;
    conn->callback = callback;
    conn->mgr = s;
    conn->last_io_time = time(NULL);
    ns_add_conn(s, conn);
    DBG(("%p %d", conn, sock));
  }
  return conn;
}